

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O0

Maybe<kj::Array<unsigned_char>_> *
kj::parse::
Many_<kj::parse::Transform_<kj::parse::Sequence_<const_kj::parse::ConstResult_<kj::parse::Many_<kj::parse::ConstResult_<kj::parse::CharGroup_,_kj::_::Tuple<>_>,_false>,_kj::_::Tuple<>_>_&,_const_kj::parse::CharGroup__&,_const_kj::parse::CharGroup__&>,_kj::parse::_::ParseHexByte>,_true>
::Impl<capnp::compiler::Lexer::ParserInput,_unsigned_char>::apply
          (Maybe<kj::Array<unsigned_char>_> *__return_storage_ptr__,
          Transform_<kj::parse::Sequence_<const_kj::parse::ConstResult_<kj::parse::Many_<kj::parse::ConstResult_<kj::parse::CharGroup_,_kj::_::Tuple<>_>,_false>,_kj::_::Tuple<>_>_&,_const_kj::parse::CharGroup__&,_const_kj::parse::CharGroup__&>,_kj::parse::_::ParseHexByte>
          *subParser,ParserInput *input)

{
  bool bVar1;
  NullableValue<unsigned_char> *other;
  uchar *puVar2;
  Array<unsigned_char> local_a0;
  int local_84;
  uchar *local_80;
  uchar *subResult;
  NullableValue<unsigned_char> _subResult425;
  undefined1 local_68 [8];
  ParserInput subInput;
  Results results;
  ParserInput *input_local;
  Transform_<kj::parse::Sequence_<const_kj::parse::ConstResult_<kj::parse::Many_<kj::parse::ConstResult_<kj::parse::CharGroup_,_kj::_::Tuple<>_>,_false>,_kj::_::Tuple<>_>_&,_const_kj::parse::CharGroup__&,_const_kj::parse::CharGroup__&>,_kj::parse::_::ParseHexByte>
  *subParser_local;
  
  Vector<unsigned_char>::Vector((Vector<unsigned_char> *)&subInput.begin);
  do {
    bVar1 = IteratorInput<char,_const_char_*>::atEnd
                      (&input->super_IteratorInput<char,_const_char_*>);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    ::capnp::compiler::Lexer::ParserInput::ParserInput((ParserInput *)local_68,input);
    Transform_<kj::parse::Sequence_<const_kj::parse::ConstResult_<kj::parse::Many_<kj::parse::ConstResult_<kj::parse::CharGroup_,_kj::_::Tuple<>_>,_false>,_kj::_::Tuple<>_>_&,_const_kj::parse::CharGroup__&,_const_kj::parse::CharGroup__&>,_kj::parse::_::ParseHexByte>
    ::operator()<capnp::compiler::Lexer::ParserInput>
              ((Transform_<kj::parse::Sequence_<const_kj::parse::ConstResult_<kj::parse::Many_<kj::parse::ConstResult_<kj::parse::CharGroup_,_kj::_::Tuple<>_>,_false>,_kj::_::Tuple<>_>_&,_const_kj::parse::CharGroup__&,_const_kj::parse::CharGroup__&>,_kj::parse::_::ParseHexByte>
                *)&subResult,(ParserInput *)subParser);
    other = kj::_::readMaybe<unsigned_char>((Maybe<unsigned_char> *)&subResult);
    kj::_::NullableValue<unsigned_char>::NullableValue
              ((NullableValue<unsigned_char> *)((long)&subResult + 2),other);
    Maybe<unsigned_char>::~Maybe((Maybe<unsigned_char> *)&subResult);
    puVar2 = kj::_::NullableValue::operator_cast_to_unsigned_char_
                       ((NullableValue *)((long)&subResult + 2));
    if (puVar2 == (uchar *)0x0) {
      local_84 = 3;
    }
    else {
      local_80 = kj::_::NullableValue<unsigned_char>::operator*
                           ((NullableValue<unsigned_char> *)((long)&subResult + 2));
      IteratorInput<char,_const_char_*>::advanceParent
                ((IteratorInput<char,_const_char_*> *)local_68);
      puVar2 = mv<unsigned_char>(local_80);
      Vector<unsigned_char>::add<unsigned_char>((Vector<unsigned_char> *)&subInput.begin,puVar2);
      local_84 = 0;
    }
    kj::_::NullableValue<unsigned_char>::~NullableValue
              ((NullableValue<unsigned_char> *)((long)&subResult + 2));
    if (local_84 == 0) {
      local_84 = 0;
    }
    ::capnp::compiler::Lexer::ParserInput::~ParserInput((ParserInput *)local_68);
  } while (local_84 == 0);
  bVar1 = Vector<unsigned_char>::empty((Vector<unsigned_char> *)&subInput.begin);
  if (bVar1) {
    Maybe<kj::Array<unsigned_char>_>::Maybe(__return_storage_ptr__);
  }
  else {
    Vector<unsigned_char>::releaseAsArray(&local_a0,(Vector<unsigned_char> *)&subInput.begin);
    Maybe<kj::Array<unsigned_char>_>::Maybe(__return_storage_ptr__,&local_a0);
    Array<unsigned_char>::~Array(&local_a0);
  }
  local_84 = 1;
  Vector<unsigned_char>::~Vector((Vector<unsigned_char> *)&subInput.begin);
  return __return_storage_ptr__;
}

Assistant:

static Maybe<Array<Output>> apply(const SubParser& subParser, Input& input) {
    typedef Vector<OutputType<SubParser, Input>> Results;
    Results results;

    while (!input.atEnd()) {
      Input subInput(input);

      KJ_IF_SOME(subResult, subParser(subInput)) {
        subInput.advanceParent();
        results.add(kj::mv(subResult));
      } else {
        break;
      }
    }